

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

uint32 __thiscall Js::RecyclableObjectWalker::GetChildrenCount(RecyclableObjectWalker *this)

{
  Type TVar1;
  Type ppDVar2;
  JavascriptRegExpConstructor *this_00;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar3;
  code *pcVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  BOOL BVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ArenaAllocator *alloc;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar13;
  JavascriptRegExpConstructor *instance;
  undefined4 *puVar14;
  Type *pTVar15;
  JavascriptString *propertyString;
  Var pvVar16;
  undefined4 extraout_var;
  PropertyId *pPVar17;
  JavascriptProxy *_instance;
  RecyclableProxyObjectWalker *this_01;
  RecyclableObject *pRVar18;
  RecyclableProtoObjectWalker *this_02;
  RecyclableArgumentsArrayWalker *this_03;
  JavascriptPromise *_instance_00;
  RecyclablePromiseObjectWalker *this_04;
  DynamicObject *pDVar19;
  JavascriptWeakSet *pJVar20;
  ScriptContext *pSVar21;
  RecyclableArrayWalker *this_05;
  ulong uVar22;
  undefined *puVar23;
  Var instance_00;
  ulong uVar24;
  Type typeId;
  ulong uVar25;
  uint uVar26;
  ArrayObject *obj;
  Type TVar27;
  undefined1 auStack_d8 [8];
  JavascriptStaticEnumerator enumerator;
  uint local_64;
  PropertyRecord *pPStack_60;
  uint32 indexVal;
  Var varValue;
  JavascriptRegExpConstructor *local_50;
  ArenaAllocator *local_48;
  RecyclableMethodsGroupWalker *local_40;
  RecyclableMethodsGroupWalker *pMethodsGroupWalker;
  PropertyId propertyId;
  
  if (this->pMembersList !=
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    iVar9 = (this->pMembersList->
            super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
    TVar27 = 0;
    iVar12 = 0;
    if (this->innerArrayObjectWalker != (RecyclableArrayWalker *)0x0) {
      iVar12 = (*(this->innerArrayObjectWalker->super_RecyclableObjectWalker).
                 super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase[1])();
    }
    if (this->fakeGroupObjectWalkerList !=
        (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)0x0) {
      TVar27 = (this->fakeGroupObjectWalkerList->
               super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
               ).count;
    }
    return iVar12 + iVar9 + TVar27;
  }
  alloc = GetArenaFromContext(this->scriptContext);
  pLVar13 = (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
  (pLVar13->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  alloc = alloc;
  (pLVar13->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014e4370;
  (pLVar13->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  buffer = (Type)0x0;
  (pLVar13->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  count = 0;
  pLVar13->length = 0;
  pLVar13->increment = 4;
  this->pMembersList = pLVar13;
  local_40 = (RecyclableMethodsGroupWalker *)0x0;
  bVar6 = VarIs<Js::RecyclableObject>(this->instance);
  if (!bVar6) goto LAB_008b517f;
  instance = (JavascriptRegExpConstructor *)VarTo<Js::RecyclableObject>(this->instance);
  local_50 = instance;
  if (this->originalInstance != (Var)0x0) {
    local_50 = (JavascriptRegExpConstructor *)VarTo<Js::RecyclableObject>(this->originalInstance);
  }
  pvVar16 = this->instance;
  if (pvVar16 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar6) goto LAB_008b5277;
    *puVar14 = 0;
LAB_008b451b:
    pRVar18 = UnsafeVarTo<Js::RecyclableObject>(pvVar16);
    if (pRVar18 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar6) goto LAB_008b5277;
      *puVar14 = 0;
    }
    typeId = ((pRVar18->type).ptr)->typeId;
    if ((0x57 < (int)typeId) && (BVar8 = RecyclableObject::IsExternal(pRVar18), BVar8 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar6) goto LAB_008b5277;
LAB_008b45ec:
      *puVar14 = 0;
    }
  }
  else {
    if (((ulong)pvVar16 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar16 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar6) goto LAB_008b5277;
      typeId = TypeIds_FirstNumberType;
      goto LAB_008b45ec;
    }
    typeId = TypeIds_FirstNumberType;
    if ((((ulong)pvVar16 & 0xffff000000000000) != 0x1000000000000) &&
       (typeId = TypeIds_Number, (ulong)pvVar16 >> 0x32 == 0)) goto LAB_008b451b;
  }
  BVar8 = JavascriptOperators::IsObject((RecyclableObject *)instance);
  if (BVar8 != 0) {
    BVar8 = RecyclableObject::IsExternal((RecyclableObject *)instance);
    if (BVar8 == 0) {
      if (instance == (JavascriptRegExpConstructor *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar6) goto LAB_008b5277;
        *puVar14 = 0;
      }
      pTVar15 = (instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                super_RecyclableObject.type.ptr;
      if ((int)pTVar15->typeId < 0x58) {
        if (pTVar15->typeId == TypeIds_Proxy) goto LAB_008b463b;
      }
      else {
        BVar8 = RecyclableObject::IsExternal((RecyclableObject *)instance);
        if (BVar8 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar6) goto LAB_008b5277;
          *puVar14 = 0;
        }
      }
      TVar1 = ((instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
               super_RecyclableObject.type.ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 != TypeIds_UnscopablesWrapperObject) goto LAB_008b490b;
        pvVar16 = JavascriptOperators::OP_UnwrapWithObj(instance);
        instance = (JavascriptRegExpConstructor *)UnsafeVarTo<Js::RecyclableObject>(pvVar16);
        pMethodsGroupWalker._4_4_ = (undefined4)CONCAT71((int7)((ulong)instance >> 8),1);
      }
      else {
        BVar8 = RecyclableObject::IsExternal((RecyclableObject *)instance);
        if (BVar8 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar6) goto LAB_008b5277;
          *puVar14 = 0;
        }
LAB_008b490b:
        pMethodsGroupWalker._4_4_ = 0;
      }
      local_48 = alloc;
      uVar10 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                 super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[10])(instance);
      if (0 < (int)uVar10) {
        uVar25 = 0;
        do {
          iVar9 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])(instance,uVar25 & 0xffff);
          if (pMethodsGroupWalker._4_1_ == '\0') {
            bVar6 = false;
          }
          else {
            BVar8 = JavascriptOperators::IsPropertyUnscopable(instance,iVar9);
            bVar6 = BVar8 != 0;
          }
          if (iVar9 - 0x10U < 0xffffffef) {
            InsertItem(this,(RecyclableObject *)local_50,(RecyclableObject *)instance,iVar9,false,
                       bVar6,&local_40,false);
          }
          uVar26 = (int)uVar25 + 1;
          uVar25 = (ulong)uVar26;
        } while (uVar10 != uVar26);
      }
      if (DAT_0159ef8b != '\0') {
        uVar10 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                   super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x40])(instance);
        iVar9 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x41])(instance);
        enumerator.arrayEnumerator.ptr = (JavascriptEnumerator *)CONCAT44(extraout_var,iVar9);
        if (0 < (int)uVar10) {
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          uVar25 = 0;
          do {
            iVar9 = *(int *)((long)&((enumerator.arrayEnumerator.ptr)->super_RecyclableObject).
                                    super_FinalizableObject.super_IRecyclerVisitedObject.
                                    _vptr_IRecyclerVisitedObject + uVar25 * 4);
            if (pMethodsGroupWalker._4_1_ == '\0') {
              varValue._4_4_ = 0;
            }
            else {
              BVar8 = JavascriptOperators::IsPropertyUnscopable(instance,iVar9);
              varValue._4_4_ = CONCAT31((int3)((uint)BVar8 >> 8),BVar8 != 0);
            }
            if (iVar9 != -1) {
              bVar6 = true;
              if (iVar9 == 0xd1) {
                bVar6 = JavascriptArray::IsNonES5Array(instance);
                bVar6 = !bVar6;
              }
              bVar7 = VarIs<Js::BoundFunction,Js::RecyclableObject>((RecyclableObject *)instance);
              ppDVar2 = (this->pMembersList->
                        super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                        ).buffer;
              uVar26 = (this->pMembersList->
                       super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                       ).count;
              uVar22 = (ulong)uVar26;
              if (bVar7) {
                if (0 < (int)uVar26) {
                  if ((*ppDVar2)->propId != iVar9) {
                    uVar5 = 1;
                    do {
                      uVar24 = uVar5;
                      if (uVar22 == uVar24) break;
                      uVar5 = uVar24 + 1;
                    } while (ppDVar2[uVar24]->propId != iVar9);
                    if (uVar22 <= uVar24) goto LAB_008b4a8b;
                  }
                  goto LAB_008b4b25;
                }
              }
              else {
LAB_008b4a8b:
                if (0 < (int)uVar26) {
                  if ((*ppDVar2)->propId != iVar9) {
                    uVar5 = 1;
                    do {
                      uVar24 = uVar5;
                      if (uVar22 == uVar24) break;
                      uVar5 = uVar24 + 1;
                    } while (ppDVar2[uVar24]->propId != iVar9);
                    if (uVar22 <= uVar24) goto LAB_008b4aff;
                  }
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar14 = 1;
                  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                              ,0x9ec,"(!this->pMembersList->Any(containsPredicate))"
                                              ,
                                              "Special property already on the object, no need to insert."
                                             );
                  if (!bVar7) goto LAB_008b5277;
                  *puVar14 = 0;
                }
              }
LAB_008b4aff:
              InsertItem(this,(RecyclableObject *)local_50,(RecyclableObject *)instance,iVar9,bVar6,
                         varValue._4_1_,&local_40,false);
            }
LAB_008b4b25:
            uVar25 = uVar25 + 1;
          } while (uVar25 != uVar10);
        }
        bVar6 = VarIsImpl<Js::JavascriptFunction>((RecyclableObject *)instance);
        if ((bVar6) &&
           (this_00 = (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
                      super_JavascriptLibraryBase).regexConstructor.ptr, this_00 == instance)) {
          uVar11 = JavascriptRegExpConstructor::GetSpecialEnumerablePropertyCount(this_00);
          pPVar17 = JavascriptRegExpConstructor::GetSpecialEnumerablePropertyIds(this_00);
          if (0 < (int)uVar11) {
            uVar25 = 0;
            do {
              InsertItem(this,(RecyclableObject *)local_50,(RecyclableObject *)instance,
                         pPVar17[uVar25],true,false,&local_40,false);
              uVar25 = uVar25 + 1;
            } while (uVar11 != uVar25);
          }
        }
      }
      pRVar18 = RecyclableObject::GetPrototype((RecyclableObject *)instance);
      alloc = local_48;
      if (pRVar18 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar6) goto LAB_008b5277;
        *puVar14 = 0;
      }
      TVar1 = ((pRVar18->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 == TypeIds_Null) goto LAB_008b4eed;
      }
      else {
        BVar8 = RecyclableObject::IsExternal(pRVar18);
        if (BVar8 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar6) goto LAB_008b5277;
          *puVar14 = 0;
        }
      }
      EnsureFakeGroupObjectWalkerList(this);
      this_02 = (RecyclableProtoObjectWalker *)new<Memory::ArenaAllocator>(0x38,alloc,0x364470);
      pSVar21 = this->scriptContext;
      instance_00 = this->instance;
      pvVar16 = this->originalInstance;
LAB_008b4ec1:
      RecyclableProtoObjectWalker::RecyclableProtoObjectWalker(this_02,pSVar21,instance_00,pvVar16);
      pLVar3 = this->fakeGroupObjectWalkerList;
      JsUtil::
      List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::EnsureArray(pLVar3,0);
      iVar9 = (pLVar3->
              super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
              ).count;
      (pLVar3->
      super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
      .buffer[iVar9] = (IDiagObjectModelWalkerBase *)this_02;
      (pLVar3->
      super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
      .count = iVar9 + 1;
    }
    else {
      pTVar15 = (instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                super_RecyclableObject.type.ptr;
LAB_008b463b:
      pSVar21 = (((pTVar15->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      auStack_d8 = (undefined1  [8])0x0;
      enumerator.propertyEnumerator.scriptContext.ptr = (ScriptContext *)0x0;
      enumerator.propertyEnumerator.object.ptr = (DynamicObject *)0x0;
      enumerator.propertyEnumerator.enumeratedCount = 0;
      enumerator.propertyEnumerator.flags = None;
      enumerator.propertyEnumerator._37_3_ = 0;
      enumerator.propertyEnumerator.cachedData.ptr = (CachedData *)0x0;
      enumerator.currentEnumerator.ptr = (JavascriptEnumerator *)0x0;
      enumerator.prefixEnumerator.ptr = (JavascriptEnumerator *)0x0;
      JavascriptStaticEnumerator::Clear
                ((JavascriptStaticEnumerator *)auStack_d8,None,(ScriptContext *)0x0);
      iVar9 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2b])(instance,auStack_d8,3,pSVar21);
      if (iVar9 != 0) {
        local_48 = alloc;
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        while (propertyString =
                    JavascriptStaticEnumerator::MoveAndGetNext
                              ((JavascriptStaticEnumerator *)auStack_d8,
                               (PropertyId *)&pMethodsGroupWalker,(PropertyAttributes *)0x0),
              alloc = local_48, propertyString != (JavascriptString *)0x0) {
          if ((uint)pMethodsGroupWalker == 0xffffffff) {
            ScriptContext::GetOrAddPropertyRecord(pSVar21,propertyString,&stack0xffffffffffffffa0);
            pMethodsGroupWalker._0_4_ = pPStack_60->pid;
          }
          if ((uint)pMethodsGroupWalker < 0x10) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar14 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0x987,"(!Js::IsInternalPropertyId(propertyId))",
                                        "!Js::IsInternalPropertyId(propertyId)");
            if (!bVar6) goto LAB_008b5277;
            *puVar14 = 0;
          }
          BVar8 = ScriptContext::IsNumericPropertyId(pSVar21,(uint)pMethodsGroupWalker,&local_64);
          if ((BVar8 == 0) ||
             (iVar9 = (*(instance->super_RuntimeFunction).super_JavascriptFunction.
                        super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x26])
                                (instance,instance,(ulong)local_64), iVar9 != 1)) {
            InsertItem(this,(RecyclableObject *)local_50,(RecyclableObject *)instance,
                       (uint)pMethodsGroupWalker,false,false,&local_40,true);
          }
          else {
            InsertItem(this,(uint)pMethodsGroupWalker,false,false,pPStack_60,&local_40,true);
          }
        }
      }
      if (typeId == TypeIds_Proxy) {
        EnsureFakeGroupObjectWalkerList(this);
        _instance = VarTo<Js::JavascriptProxy,Js::RecyclableObject>((RecyclableObject *)instance);
        this_01 = (RecyclableProxyObjectWalker *)new<Memory::ArenaAllocator>(0x38,alloc,0x364470);
        RecyclableProxyObjectWalker::RecyclableProxyObjectWalker
                  (this_01,this->scriptContext,_instance);
        pLVar3 = this->fakeGroupObjectWalkerList;
        JsUtil::
        List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(pLVar3,0);
        iVar9 = (pLVar3->
                super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        (pLVar3->
        super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).buffer[iVar9] = (IDiagObjectModelWalkerBase *)this_01;
        (pLVar3->
        super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).count = iVar9 + 1;
      }
      pRVar18 = RecyclableObject::GetPrototype((RecyclableObject *)instance);
      if (pRVar18 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar6) goto LAB_008b5277;
        *puVar14 = 0;
      }
      TVar1 = ((pRVar18->type).ptr)->typeId;
      if (0x57 < (int)TVar1) {
        BVar8 = RecyclableObject::IsExternal(pRVar18);
        if (BVar8 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar14 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar6) goto LAB_008b5277;
          *puVar14 = 0;
        }
LAB_008b4e8d:
        EnsureFakeGroupObjectWalkerList(this);
        this_02 = (RecyclableProtoObjectWalker *)new<Memory::ArenaAllocator>(0x38,alloc,0x364470);
        pSVar21 = this->scriptContext;
        instance_00 = this->instance;
        pvVar16 = this->originalInstance;
        if (this->originalInstance == (Var)0x0) {
          pvVar16 = instance_00;
        }
        goto LAB_008b4ec1;
      }
      if (TVar1 != TypeIds_Null) goto LAB_008b4e8d;
    }
LAB_008b4eed:
    switch(typeId) {
    case TypeIds_Map:
      EnsureFakeGroupObjectWalkerList(this);
      pJVar20 = (JavascriptWeakSet *)
                VarTo<Js::JavascriptMap,Js::RecyclableObject>((RecyclableObject *)instance);
      this_04 = (RecyclablePromiseObjectWalker *)new<Memory::ArenaAllocator>(0x20,alloc,0x364470);
      pSVar21 = this->scriptContext;
      puVar23 = &RecyclableCollectionObjectWalker<Js::JavascriptMap>::vtable;
      break;
    case TypeIds_Set:
      EnsureFakeGroupObjectWalkerList(this);
      pJVar20 = (JavascriptWeakSet *)
                VarTo<Js::JavascriptSet,Js::RecyclableObject>((RecyclableObject *)instance);
      this_04 = (RecyclablePromiseObjectWalker *)new<Memory::ArenaAllocator>(0x20,alloc,0x364470);
      pSVar21 = this->scriptContext;
      puVar23 = &RecyclableCollectionObjectWalker<Js::JavascriptSet>::vtable;
      break;
    case TypeIds_WeakMap:
      EnsureFakeGroupObjectWalkerList(this);
      pJVar20 = (JavascriptWeakSet *)
                VarTo<Js::JavascriptWeakMap,Js::RecyclableObject>((RecyclableObject *)instance);
      this_04 = (RecyclablePromiseObjectWalker *)new<Memory::ArenaAllocator>(0x20,alloc,0x364470);
      pSVar21 = this->scriptContext;
      puVar23 = &RecyclableCollectionObjectWalker<Js::JavascriptWeakMap>::vtable;
      break;
    case TypeIds_WeakSet:
      EnsureFakeGroupObjectWalkerList(this);
      pJVar20 = VarTo<Js::JavascriptWeakSet,Js::RecyclableObject>((RecyclableObject *)instance);
      this_04 = (RecyclablePromiseObjectWalker *)new<Memory::ArenaAllocator>(0x20,alloc,0x364470);
      pSVar21 = this->scriptContext;
      puVar23 = &RecyclableCollectionObjectWalker<Js::JavascriptWeakSet>::vtable;
      break;
    default:
      if (typeId != TypeIds_Promise) {
        if (typeId == TypeIds_Arguments) {
          pDVar19 = (DynamicObject *)this->instance;
          if (pDVar19 == (DynamicObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar14 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0xa19,"(argObj)","argObj");
            if (!bVar6) {
LAB_008b5277:
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            *puVar14 = 0;
          }
          iVar9 = (*(pDVar19->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])(pDVar19);
          if ((iVar9 != 0) || (bVar6 = DynamicObject::HasNonEmptyObjectArray(pDVar19), bVar6)) {
            this_03 = (RecyclableArgumentsArrayWalker *)
                      new<Memory::ArenaAllocator>(0x58,alloc,0x364470);
            RecyclableArgumentsArrayWalker::RecyclableArgumentsArrayWalker
                      (this_03,this->scriptContext,this->instance,this->originalInstance);
            this->innerArrayObjectWalker = (RecyclableArrayWalker *)this_03;
          }
        }
        else {
          bVar6 = DynamicType::Is(typeId);
          if (bVar6) {
            pDVar19 = VarTo<Js::DynamicObject>(this->instance);
            bVar6 = DynamicObject::HasNonEmptyObjectArray(pDVar19);
            if (bVar6) {
              bVar6 = DynamicObject::HasObjectArray(pDVar19);
              if (bVar6) {
                obj = *(ArrayObject **)&(pDVar19->field_1).field_1;
              }
              else {
                obj = (ArrayObject *)0x0;
              }
              bVar6 = VarIs<Js::ES5Array,Js::ArrayObject>(obj);
              if (bVar6) {
                this_05 = (RecyclableArrayWalker *)new<Memory::ArenaAllocator>(0x50,alloc,0x364470);
                RecyclableES5ArrayWalker::RecyclableES5ArrayWalker
                          ((RecyclableES5ArrayWalker *)this_05,this->scriptContext,obj,
                           this->originalInstance);
              }
              else {
                bVar6 = JavascriptArray::IsNonES5Array(obj);
                this_05 = (RecyclableArrayWalker *)new<Memory::ArenaAllocator>(0x50,alloc,0x364470);
                if (bVar6) {
                  RecyclableArrayWalker::RecyclableArrayWalker
                            (this_05,this->scriptContext,obj,this->originalInstance);
                }
                else {
                  RecyclableTypedArrayWalker::RecyclableTypedArrayWalker
                            ((RecyclableTypedArrayWalker *)this_05,this->scriptContext,obj,
                             this->originalInstance);
                }
              }
              this->innerArrayObjectWalker = this_05;
              this_05->fOnlyOwnProperties = true;
            }
          }
        }
        goto LAB_008b5171;
      }
      EnsureFakeGroupObjectWalkerList(this);
      _instance_00 = VarTo<Js::JavascriptPromise,Js::RecyclableObject>((RecyclableObject *)instance)
      ;
      this_04 = (RecyclablePromiseObjectWalker *)new<Memory::ArenaAllocator>(0x38,alloc,0x364470);
      RecyclablePromiseObjectWalker::RecyclablePromiseObjectWalker
                (this_04,this->scriptContext,_instance_00);
      goto LAB_008b5150;
    }
    (this_04->super_RecyclableObjectWalker).super_IDiagObjectModelWalkerBase.
    _vptr_IDiagObjectModelWalkerBase = (_func_int **)(puVar23 + 0x10);
    (this_04->super_RecyclableObjectWalker).scriptContext = pSVar21;
    (this_04->super_RecyclableObjectWalker).instance = pJVar20;
    (this_04->super_RecyclableObjectWalker).originalInstance = (Var)0x0;
LAB_008b5150:
    pLVar3 = this->fakeGroupObjectWalkerList;
    JsUtil::
    List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(pLVar3,0);
    iVar9 = (pLVar3->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
    (pLVar3->
    super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
    buffer[iVar9] = (IDiagObjectModelWalkerBase *)this_04;
    (pLVar3->
    super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
    count = iVar9 + 1;
  }
LAB_008b5171:
  if (local_40 != (RecyclableMethodsGroupWalker *)0x0) {
    RecyclableMethodsGroupWalker::Sort(local_40);
  }
LAB_008b517f:
  ScriptContext::GetDebugContext(this->scriptContext);
}

Assistant:

uint32 RecyclableObjectWalker::GetChildrenCount()
    {
        if (pMembersList == nullptr)
        {
            ArenaAllocator *arena = GetArenaFromContext(scriptContext);

            pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(arena);

            RecyclableMethodsGroupWalker *pMethodsGroupWalker = nullptr;

            if (Js::VarIs<Js::RecyclableObject>(instance))
            {
                Js::RecyclableObject* object = Js::VarTo<Js::RecyclableObject>(instance);
                // If we are walking a prototype, we'll use its instance for property names enumeration, but originalInstance to get values
                Js::RecyclableObject* originalObject = (originalInstance != nullptr) ? Js::VarTo<Js::RecyclableObject>(originalInstance) : object;
                const Js::TypeId typeId = JavascriptOperators::GetTypeId(instance);

                if (JavascriptOperators::IsObject(object))
                {
                    if (object->IsExternal() || JavascriptOperators::GetTypeId(object) == TypeIds_Proxy)
                    {
                        try
                        {
                            ScriptContext * objectContext = object->GetScriptContext();
                            JavascriptStaticEnumerator enumerator;
                            if (object->GetEnumerator(&enumerator, EnumeratorFlags::EnumNonEnumerable | EnumeratorFlags::EnumSymbols, objectContext))
                            {
                                Js::PropertyId propertyId;
                                JavascriptString * obj;

                                while ((obj = enumerator.MoveAndGetNext(propertyId)) != nullptr)
                                {
                                    if (propertyId == Constants::NoProperty)
                                    {
                                        const PropertyRecord* propertyRecord;
                                        objectContext->GetOrAddPropertyRecord(obj, &propertyRecord);
                                        propertyId = propertyRecord->GetPropertyId();
                                    }
                                    // MoveAndGetNext shouldn't return an internal property id
                                    Assert(!Js::IsInternalPropertyId(propertyId));

                                    uint32 indexVal;
                                    Var varValue;
                                    if (objectContext->IsNumericPropertyId(propertyId, &indexVal) && object->GetItem(object, indexVal, &varValue, objectContext))
                                    {
                                        InsertItem(propertyId, false /*isConst*/, false /*isUnscoped*/, varValue, &pMethodsGroupWalker, true /*shouldPinProperty*/);
                                    }
                                    else
                                    {
                                        InsertItem(originalObject, object, propertyId, false /*isConst*/, false /*isUnscoped*/, &pMethodsGroupWalker, true /*shouldPinProperty*/);
                                    }
                                }
                            }
                        }
                        catch (const JavascriptException& err)
                        {
                            Var error = err.GetAndClear()->GetThrownObject(scriptContext);
                            if (error != nullptr && Js::VarIs<Js::JavascriptError>(error))
                            {
                                Js::PropertyId propertyId = scriptContext->GetOrAddPropertyIdTracked(_u("{error}"));
                                InsertItem(propertyId, false /*isConst*/, false /*isUnscoped*/, error, &pMethodsGroupWalker);
                            }
                        }

                        if (typeId == TypeIds_Proxy)
                        {
                            // Provide [Proxy] group object
                            EnsureFakeGroupObjectWalkerList();

                            JavascriptProxy* proxy = VarTo<JavascriptProxy>(object);
                            RecyclableProxyObjectWalker* proxyWalker = Anew(arena, RecyclableProxyObjectWalker, scriptContext, proxy);
                            fakeGroupObjectWalkerList->Add(proxyWalker);
                        }
                        // If current object has internal proto object then provide [prototype] group object.
                        if (JavascriptOperators::GetTypeId(object->GetPrototype()) != TypeIds_Null)
                        {
                            // Has [prototype] object.
                            EnsureFakeGroupObjectWalkerList();

                            RecyclableProtoObjectWalker *pProtoWalker = Anew(arena, RecyclableProtoObjectWalker, scriptContext, instance, (originalInstance == nullptr) ? instance : originalInstance);
                            fakeGroupObjectWalkerList->Add(pProtoWalker);
                        }
                    }
                    else
                    {
                        RecyclableObject* wrapperObject = nullptr;
                        if (JavascriptOperators::GetTypeId(object) == TypeIds_UnscopablesWrapperObject)
                        {
                            wrapperObject = object;
                            object = Js::UnsafeVarTo<Js::RecyclableObject>(JavascriptOperators::OP_UnwrapWithObj(wrapperObject));
                        }

                        int count = object->GetPropertyCount();

                        for (int i = 0; i < count; i++)
                        {
                            Js::PropertyId propertyId = object->GetPropertyId((PropertyIndex)i);
                            bool isUnscoped = false;
                            if (wrapperObject && JavascriptOperators::IsPropertyUnscopable(object, propertyId))
                            {
                                isUnscoped = true;
                            }
                            if (propertyId != Js::Constants::NoProperty && !Js::IsInternalPropertyId(propertyId))
                            {
                                InsertItem(originalObject, object, propertyId, false /*isConst*/, isUnscoped, &pMethodsGroupWalker);
                            }
                        }

                        if (CONFIG_FLAG(EnumerateSpecialPropertiesInDebugger))
                        {
                            count = object->GetSpecialPropertyCount();
                            PropertyId const * specialPropertyIds = object->GetSpecialPropertyIds();
                            for (int i = 0; i < count; i++)
                            {
                                Js::PropertyId propertyId = specialPropertyIds[i];
                                bool isUnscoped = false;
                                if (wrapperObject && JavascriptOperators::IsPropertyUnscopable(object, propertyId))
                                {
                                    isUnscoped = true;
                                }
                                if (propertyId != Js::Constants::NoProperty)
                                {
                                    bool isConst = true;
                                    if (propertyId == PropertyIds::length && Js::JavascriptArray::IsNonES5Array(object))
                                    {
                                        // For JavascriptArrays, we allow resetting the length special property.
                                        isConst = false;
                                    }

                                    auto containsPredicate = [&](Js::DebuggerPropertyDisplayInfo* info) { return info->propId == propertyId; };
                                    if (Js::VarIs<Js::BoundFunction>(object)
                                        && this->pMembersList->Any(containsPredicate))
                                    {
                                        // Bound functions can already contain their special properties,
                                        // so we need to check for that (caller and arguments).  This occurs
                                        // when JavascriptFunction::EntryBind() is called.  Arguments can similarly
                                        // already display caller in compat mode 8.
                                        continue;
                                    }

                                    AssertMsg(!this->pMembersList->Any(containsPredicate), "Special property already on the object, no need to insert.");

                                    InsertItem(originalObject, object, propertyId, isConst, isUnscoped, &pMethodsGroupWalker);
                                }
                            }
                            if (Js::VarIs<Js::JavascriptFunction>(object))
                            {
                                // We need to special-case RegExp constructor here because it has some special properties (above) and some
                                // special enumerable properties which should all show up in the debugger.
                                JavascriptRegExpConstructor* regExp = scriptContext->GetLibrary()->GetRegExpConstructor();

                                if (regExp == object)
                                {
                                    bool isUnscoped = false;
                                    bool isConst = true;
                                    count = regExp->GetSpecialEnumerablePropertyCount();
                                    PropertyId const * specialEnumerablePropertyIds = regExp->GetSpecialEnumerablePropertyIds();

                                    for (int i = 0; i < count; i++)
                                    {
                                        Js::PropertyId propertyId = specialEnumerablePropertyIds[i];

                                        InsertItem(originalObject, object, propertyId, isConst, isUnscoped, &pMethodsGroupWalker);
                                    }
                                }
                            }
                        }

                        // If current object has internal proto object then provide [prototype] group object.
                        if (JavascriptOperators::GetTypeId(object->GetPrototype()) != TypeIds_Null)
                        {
                            // Has [prototype] object.
                            EnsureFakeGroupObjectWalkerList();

                            RecyclableProtoObjectWalker *pProtoWalker = Anew(arena, RecyclableProtoObjectWalker, scriptContext, instance, originalInstance);
                            fakeGroupObjectWalkerList->Add(pProtoWalker);
                        }
                    }

                    // If the object contains array indices.
                    if (typeId == TypeIds_Arguments)
                    {
                        // Create ArgumentsArray walker for an arguments object

                        Js::ArgumentsObject * argObj = static_cast<Js::ArgumentsObject*>(instance);
                        Assert(argObj);

                        if (argObj->GetNumberOfArguments() > 0 || argObj->HasNonEmptyObjectArray())
                        {
                            innerArrayObjectWalker = Anew(arena, RecyclableArgumentsArrayWalker, scriptContext, (Var)instance, originalInstance);
                        }
                    }
                    else if (typeId == TypeIds_Map)
                    {
                        // Provide [Map] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptMap* map = VarTo<JavascriptMap>(object);
                        RecyclableMapObjectWalker *pMapWalker = Anew(arena, RecyclableMapObjectWalker, scriptContext, map);
                        fakeGroupObjectWalkerList->Add(pMapWalker);
                    }
                    else if (typeId == TypeIds_Set)
                    {
                        // Provide [Set] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptSet* set = VarTo<JavascriptSet>(object);
                        RecyclableSetObjectWalker *pSetWalker = Anew(arena, RecyclableSetObjectWalker, scriptContext, set);
                        fakeGroupObjectWalkerList->Add(pSetWalker);
                    }
                    else if (typeId == TypeIds_WeakMap)
                    {
                        // Provide [WeakMap] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptWeakMap* weakMap = VarTo<JavascriptWeakMap>(object);
                        RecyclableWeakMapObjectWalker *pWeakMapWalker = Anew(arena, RecyclableWeakMapObjectWalker, scriptContext, weakMap);
                        fakeGroupObjectWalkerList->Add(pWeakMapWalker);
                    }
                    else if (typeId == TypeIds_WeakSet)
                    {
                        // Provide [WeakSet] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptWeakSet* weakSet = VarTo<JavascriptWeakSet>(object);
                        RecyclableWeakSetObjectWalker *pWeakSetWalker = Anew(arena, RecyclableWeakSetObjectWalker, scriptContext, weakSet);
                        fakeGroupObjectWalkerList->Add(pWeakSetWalker);
                    }
                    else if (typeId == TypeIds_Promise)
                    {
                        // Provide [Promise] group object.
                        EnsureFakeGroupObjectWalkerList();

                        JavascriptPromise* promise = VarTo<JavascriptPromise>(object);
                        RecyclablePromiseObjectWalker *pPromiseWalker = Anew(arena, RecyclablePromiseObjectWalker, scriptContext, promise);
                        fakeGroupObjectWalkerList->Add(pPromiseWalker);
                    }
                    else if (Js::DynamicType::Is(typeId))
                    {
                        DynamicObject *const dynamicObject = Js::VarTo<Js::DynamicObject>(instance);
                        if (dynamicObject->HasNonEmptyObjectArray())
                        {
                            ArrayObject* objectArray = dynamicObject->GetObjectArray();
                            if (Js::VarIs<Js::ES5Array>(objectArray))
                            {
                                innerArrayObjectWalker = Anew(arena, RecyclableES5ArrayWalker, scriptContext, objectArray, originalInstance);
                            }
                            else if (Js::JavascriptArray::IsNonES5Array(objectArray))
                            {
                                innerArrayObjectWalker = Anew(arena, RecyclableArrayWalker, scriptContext, objectArray, originalInstance);
                            }
                            else
                            {
                                innerArrayObjectWalker = Anew(arena, RecyclableTypedArrayWalker, scriptContext, objectArray, originalInstance);
                            }

                            innerArrayObjectWalker->SetOnlyWalkOwnProperties(true);
                        }
                    }
                }
            }
            // Sort the members of the methods group
            if (pMethodsGroupWalker)
            {
                pMethodsGroupWalker->Sort();
            }

            // Sort current pMembersList.
            HostDebugContext* hostDebugContext = scriptContext->GetDebugContext()->GetHostDebugContext();
            if (hostDebugContext != nullptr)
            {
                hostDebugContext->SortMembersList(pMembersList, scriptContext);
            }
        }

        uint32 childrenCount =
            pMembersList->Count()
          + (innerArrayObjectWalker ? innerArrayObjectWalker->GetChildrenCount() : 0)
          + (fakeGroupObjectWalkerList ? fakeGroupObjectWalkerList->Count() : 0);

        return childrenCount;
    }